

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

Index __thiscall MADPComponentFactoredStates::SampleInitialState(MADPComponentFactoredStates *this)

{
  Index IVar1;
  ostream *poVar2;
  E *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacValues;
  
  if (this->_m_initialized != false) {
    sfacValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sfacValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sfacValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    SampleInitialState(this,&sfacValues);
    IVar1 = FactorValueIndicesToStateIndex(this,&sfacValues);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sfacValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return IVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sfacValues);
  poVar2 = std::operator<<((ostream *)
                           &sfacValues.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           "MADPComponentFactoredStates::SampleInitialState()");
  poVar2 = std::operator<<(poVar2," - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,(stringstream *)&sfacValues);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentFactoredStates::SampleInitialState() const
{
  if(!_m_initialized)
  {
    stringstream ss;
    ss << "MADPComponentFactoredStates::SampleInitialState()" <<
      " - Error: not initialized. " << endl;
    throw E(ss);
  }

  vector<Index> sfacValues;
  SampleInitialState(sfacValues);
  Index state = FactorValueIndicesToStateIndex(sfacValues);
  return(state);
}